

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::DumpStatementMaps(FunctionBody *this)

{
  StatementMap *pSVar1;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type *pTVar2;
  uint uVar3;
  uint index;
  
  this_00 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)4,void*>
                         ((FunctionProxy *)this);
  if (this_00 !=
      (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    Output::Print(L"Statement Map:\nstatementId, SourceSpan, ByteCodeSpan\n");
    uVar3 = (this_00->
            super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>)
            .count;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    for (index = 0; uVar3 != index; index = index + 1) {
      pTVar2 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,index);
      pSVar1 = pTVar2->ptr;
      Output::Print(L"S%4d, (C%5d, C%5d)  (B%5d, B%5d) Inner=%d\n",(ulong)index,
                    (ulong)(uint)(pSVar1->sourceSpan).begin,(ulong)(uint)(pSVar1->sourceSpan).end,
                    (ulong)(uint)(pSVar1->byteCodeSpan).begin,
                    (ulong)(uint)(pSVar1->byteCodeSpan).end,(uint)pSVar1->isSubexpression);
    }
  }
  return;
}

Assistant:

void FunctionBody::DumpStatementMaps()
    {
        // Source Map to ByteCode
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps)
        {
            Output::Print(_u("Statement Map:\nstatementId, SourceSpan, ByteCodeSpan\n"));
            int count = pStatementMaps->Count();
            for(int i = 0; i < count; i++)
            {
                StatementMap* map = pStatementMaps->Item(i);

                Output::Print(_u("S%4d, (C%5d, C%5d)  (B%5d, B%5d) Inner=%d\n"), i,
                                                      map->sourceSpan.begin,
                                                      map->sourceSpan.end,
                                                      map->byteCodeSpan.begin,
                                                      map->byteCodeSpan.end,
                                                      map->isSubexpression);
            }
        }
    }